

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET reenc_calc_super_frm_ratio(void *ctx,EncRcTaskInfo *cfg)

{
  RK_S32 RVar1;
  RcModelV2Ctx *p;
  EncRcTaskInfo *cfg_local;
  void *ctx_local;
  
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","reenc_calc_super_frm_ratio",ctx);
  }
  *(int *)((long)ctx + 0x230) =
       (((cfg->bit_real - *(int *)((long)ctx + 0x200)) * 4) / cfg->bit_target) * 0xa0;
  RVar1 = mpp_clip(*(RK_S32 *)((long)ctx + 0x230),0x80,0x280);
  *(RK_S32 *)((long)ctx + 0x230) = RVar1;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","reenc_calc_super_frm_ratio",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET reenc_calc_super_frm_ratio(void *ctx, EncRcTaskInfo *cfg)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;

    rc_dbg_func("enter %p\n", p);
    p->next_ratio = 160 * (4 * (cfg->bit_real - p->cur_super_thd) / cfg->bit_target);
    p->next_ratio = mpp_clip(p->next_ratio, 128, 640);
    rc_dbg_func("leave %p\n", p);
    return MPP_OK;
}